

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QToolBarAreaLayout::unplug(QToolBarAreaLayout *this,QList<int> *path,QToolBarAreaLayout *other)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QToolBarAreaLayoutItem *pQVar4;
  reference pQVar5;
  const_reference piVar6;
  long lVar7;
  qsizetype qVar8;
  reference this_00;
  long in_RDX;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem *previous_1;
  int i_1;
  QToolBarAreaLayoutLine *line_1;
  QToolBarAreaLayoutInfo *info_1;
  QToolBarAreaLayoutItem *next;
  int j;
  QToolBarAreaLayoutItem *previous;
  int i;
  int newExtraSpace;
  QToolBarAreaLayoutLine *line;
  QToolBarAreaLayoutInfo *info;
  QToolBarAreaLayoutItem *item;
  QSize *in_stack_ffffffffffffff08;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  Orientation in_stack_ffffffffffffff1c;
  Orientation o;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff38;
  int iVar9;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QToolBarAreaLayout *in_stack_ffffffffffffff48;
  int local_84;
  int local_64;
  int local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QToolBarAreaLayout::item
                     (in_stack_ffffffffffffff48,
                      (QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  QList<int>::at((QList<int> *)in_stack_ffffffffffffff10,(qsizetype)in_stack_ffffffffffffff08);
  QList<int>::at((QList<int> *)in_stack_ffffffffffffff10,(qsizetype)in_stack_ffffffffffffff08);
  pQVar5 = QList<QToolBarAreaLayoutLine>::operator[]
                     ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff10,
                      (qsizetype)in_stack_ffffffffffffff08);
  iVar9 = pQVar4->size;
  QToolBarAreaLayoutItem::realSizeHint
            ((QToolBarAreaLayoutItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
            );
  iVar3 = pick((Orientation)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08);
  if (iVar9 != iVar3) {
    piVar6 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff10,
                            (qsizetype)in_stack_ffffffffffffff08);
    local_58 = *piVar6;
    do {
      local_58 = local_58 + -1;
      if (local_58 < 0) goto LAB_006f5450;
      QList<QToolBarAreaLayoutItem>::operator[]
                ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff10,
                 (qsizetype)in_stack_ffffffffffffff08);
      bVar2 = QToolBarAreaLayoutItem::skip
                        ((QToolBarAreaLayoutItem *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    } while (bVar2);
    piVar6 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff10,
                            (qsizetype)in_stack_ffffffffffffff08);
    local_64 = *piVar6;
    do {
      local_64 = local_64 + 1;
      lVar7 = (long)local_64;
      qVar8 = QList<QToolBarAreaLayoutItem>::size(&pQVar5->toolBarItems);
      if (qVar8 <= lVar7) goto LAB_006f5450;
      QList<QToolBarAreaLayoutItem>::at
                ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff10,
                 (qsizetype)in_stack_ffffffffffffff08);
      bVar2 = QToolBarAreaLayoutItem::skip
                        ((QToolBarAreaLayoutItem *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      iVar9 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    } while (bVar2);
    QToolBarAreaLayoutItem::sizeHint(in_stack_ffffffffffffff10);
    pick((Orientation)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08);
    QToolBarAreaLayoutItem::resize(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,iVar9);
LAB_006f5450:
    if (in_RDX != 0) {
      piVar6 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff10,
                              (qsizetype)in_stack_ffffffffffffff08);
      lVar7 = in_RDX + 0x18 + (long)*piVar6 * 0x38;
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff10,(qsizetype)in_stack_ffffffffffffff08);
      pQVar5 = QList<QToolBarAreaLayoutLine>::operator[]
                         ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff10,
                          (qsizetype)in_stack_ffffffffffffff08);
      piVar6 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff10,
                              (qsizetype)in_stack_ffffffffffffff08);
      local_84 = *piVar6;
      do {
        local_84 = local_84 + -1;
        if (local_84 < 0) goto LAB_006f55bc;
        this_00 = QList<QToolBarAreaLayoutItem>::operator[]
                            ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff10,
                             (qsizetype)in_stack_ffffffffffffff08);
        bVar2 = QToolBarAreaLayoutItem::skip
                          ((QToolBarAreaLayoutItem *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        iVar9 = (int)((ulong)lVar7 >> 0x20);
      } while (bVar2);
      o = pQVar5->o;
      QToolBarAreaLayoutItem::sizeHint(in_stack_ffffffffffffff10);
      pick((Orientation)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08);
      QToolBarAreaLayoutItem::resize(this_00,o,iVar9);
    }
  }
LAB_006f55bc:
  pQVar4->gap = true;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar4->widgetItem;
}

Assistant:

QLayoutItem *QToolBarAreaLayout::unplug(const QList<int> &path, QToolBarAreaLayout *other)
{
    //other needs to be update as well
    Q_ASSERT(path.size() == 3);
    QToolBarAreaLayoutItem *item = this->item(path);
    Q_ASSERT(item);

    //update the leading space here
    QToolBarAreaLayoutInfo &info = docks[path.at(0)];
    QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
    if (item->size != pick(line.o, item->realSizeHint())) {
        //the item doesn't have its default size
        //so we'll give this to the next item
        int newExtraSpace = 0;
        //let's iterate over the siblings of the current item that pare placed before it
        //we need to find just the one before
        for (int i = path.at(2) - 1; i >= 0; --i) {
            QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
            if (!previous.skip()) {
                //we need to check if it has a previous element and a next one
                //the previous will get its size changed
                for (int j = path.at(2) + 1; j < line.toolBarItems.size(); ++j) {
                    const QToolBarAreaLayoutItem &next = line.toolBarItems.at(j);
                    if (!next.skip()) {
                        newExtraSpace = next.pos - previous.pos - pick(line.o, previous.sizeHint());
                        previous.resize(line.o, next.pos - previous.pos);
                        break;
                    }
                }
                break;
            }
        }

        if (other) {
            QToolBarAreaLayoutInfo &info = other->docks[path.at(0)];
            QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
            for (int i = path.at(2) - 1; i >= 0; --i) {
                QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
                if (!previous.skip()) {
                    previous.resize(line.o, pick(line.o, previous.sizeHint()) + newExtraSpace);
                    break;
                }
            }

        }
    }

    Q_ASSERT(!item->gap);
    item->gap = true;
    return item->widgetItem;
}